

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nonogram.cpp
# Opt level: O3

Known * __thiscall
Nonogram::get_board_horizontal(Known *__return_storage_ptr__,Nonogram *this,uint y,Board *board)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  pointer pvVar5;
  pointer pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  allocator_type local_82;
  allocator_type local_81;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)this->m_x,(bool *)&local_80,&local_82);
  local_82 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)this->m_x,(bool *)&local_82,&local_81);
  iVar1 = this->m_x;
  if (0 < (long)iVar1) {
    pvVar5 = (board->first).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (board->second).
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = 1L << ((byte)y & 0x3f);
    lVar2 = CONCAT71(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                     local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
    uVar4 = 0;
    do {
      uVar8 = 1L << ((byte)uVar4 & 0x3f);
      uVar9 = uVar4 >> 6 & 0x3ffffff;
      if ((*(ulong *)(*(long *)&(pvVar5->super__Bvector_base<std::allocator<bool>_>)._M_impl +
                     (ulong)(y >> 6) * 8) & uVar7) == 0) {
        uVar10 = ~uVar8 & local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9];
      }
      else {
        uVar10 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9] | uVar8;
      }
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar9] = uVar10;
      if ((*(ulong *)(*(long *)&(pvVar6->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                super__Bvector_impl_data + (ulong)(y >> 6) * 8) & uVar7) == 0) {
        uVar8 = ~uVar8 & *(ulong *)(lVar2 + uVar9 * 8);
      }
      else {
        uVar8 = uVar8 | *(ulong *)(lVar2 + uVar9 * 8);
      }
      *(ulong *)(lVar2 + uVar9 * 8) = uVar8;
      uVar4 = uVar4 + 1;
      pvVar5 = pvVar5 + 1;
      pvVar6 = pvVar6 + 1;
    } while ((long)iVar1 != uVar4);
  }
  std::pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>_>::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<bool,_std::allocator<bool>_>_&,_true>
            (__return_storage_ptr__,&local_58,&local_80);
  pvVar3 = (void *)CONCAT71(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                            local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Known Nonogram::get_board_horizontal(unsigned int y, const Board &board) const {
    vector<bool> set(m_x), value(m_x);

    for (int i = 0; i < m_x; i++) {
        set[i] = board.first[i][y];
        value[i] = board.second[i][y];
    }

    return {set, value};
}